

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicUnsizedArrayCase::BlockBasicUnsizedArrayCase
          (BlockBasicUnsizedArrayCase *this,Context *context,char *name,char *description,
          VarType *elementType,int arraySize,deUint32 layoutFlags)

{
  BufferBlock *pBVar1;
  VarType local_80;
  BufferVar local_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,context->m_testCtx,context->m_renderCtx,name,
             glcts::fixed_sample_locations_values + 1,GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_01e4bb98;
  pBVar1 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  glu::VarType::VarType(&local_80,(VarType *)description,-1);
  bb::BufferVar::BufferVar(&local_68,"var",&local_80,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (&pBVar1->m_variables,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  pBVar1->m_flags = arraySize;
  *(pBVar1->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = (int)elementType;
  return;
}

Assistant:

BlockBasicUnsizedArrayCase (Context& context, const char* name, const char* description, const VarType& elementType, int arraySize, deUint32 layoutFlags)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", VarType(elementType, VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		block.setLastUnsizedArraySize(0, arraySize);
	}